

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O1

void Abc_NtkRecAdd3(Abc_Ntk_t *pNtk,int fUseSOPB)

{
  Gia_Man_t *p;
  Lms_Man_t *pLVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  long lVar3;
  long lVar4;
  timespec ts_1;
  If_Par_t Pars;
  timespec local_160;
  If_Par_t local_150;
  
  iVar2 = clock_gettime(3,(timespec *)&local_150);
  if (iVar2 < 0) {
    lVar4 = -1;
  }
  else {
    lVar4 = (long)(((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816((long)local_150._8_8_),8) >>
                         7) -
                   (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816((long)local_150._8_8_),0xc) >> 0x1f
                   )) + local_150.nLutSize * 1000000);
  }
  iVar2 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar2 != 0) {
    puts("Performing recoding structures with choices.");
  }
  pLVar1 = s_pMan3;
  s_pMan3->fLibConstr = 1;
  p = pLVar1->pGia;
  if ((p != (Gia_Man_t *)0x0) && (p->pHTable == (int *)0x0)) {
    Gia_ManHashStart(p);
  }
  memset(&local_150,0,0x130);
  local_150.nLutSize = s_pMan3->nVars;
  local_150.nCutsMax = s_pMan3->nCuts;
  local_150.DelayTarget = -1.0;
  local_150.Epsilon = 0.005;
  local_150.fArea = 1;
  local_150.fDelayOpt = (int)(fUseSOPB != 0);
  local_150.fTruth = 1;
  local_150.fCutMin = (int)(fUseSOPB == 0);
  local_150.fSkipCutFilter = 0;
  local_150.pFuncCost = (_func_int_If_Man_t_ptr_If_Cut_t_ptr *)0x0;
  local_150.pFuncUser = Abc_NtkRecAddCut3;
  local_150.fUsePerm = local_150.fDelayOpt;
  pNtk_00 = Abc_NtkIf(pNtk,&local_150);
  Abc_NtkDelete(pNtk_00);
  iVar2 = clock_gettime(3,&local_160);
  if (iVar2 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_160.tv_nsec / 1000 + local_160.tv_sec * 1000000;
  }
  s_pMan3->timeTotal = s_pMan3->timeTotal + (lVar3 - lVar4);
  return;
}

Assistant:

void Abc_NtkRecAdd3( Abc_Ntk_t * pNtk, int fUseSOPB )
{
    extern Abc_Ntk_t * Abc_NtkIf( Abc_Ntk_t * pNtk, If_Par_t * pPars );
    If_Par_t Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkNew;
    int clk = Abc_Clock();
    if ( Abc_NtkGetChoiceNum( pNtk ) )
        printf( "Performing recoding structures with choices.\n" );
    // remember that the manager was used for library construction
    s_pMan3->fLibConstr = 1;
    // create hash table if not available
    if ( s_pMan3->pGia && s_pMan3->pGia->pHTable == NULL )
        Gia_ManHashStart( s_pMan3->pGia );

    // set defaults
    memset( pPars, 0, sizeof(If_Par_t) );
    // user-controlable paramters
    pPars->nLutSize    =  s_pMan3->nVars;
    pPars->nCutsMax    =  s_pMan3->nCuts;
    pPars->DelayTarget = -1;
    pPars->Epsilon     =  (float)0.005;
    pPars->fArea       =  1;
    // internal parameters
    if ( fUseSOPB )
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  0;
        pPars->fUsePerm    =  1; 
        pPars->fDelayOpt   =  1;
    }
    else
    {
        pPars->fTruth      =  1;
        pPars->fCutMin     =  1;
        pPars->fUsePerm    =  0; 
        pPars->fDelayOpt   =  0;
    }
    pPars->fSkipCutFilter = 0;
    pPars->pFuncCost   =  NULL;
    pPars->pFuncUser   =  Abc_NtkRecAddCut3;
    // perform recording
    pNtkNew = Abc_NtkIf( pNtk, pPars );
    Abc_NtkDelete( pNtkNew );
s_pMan3->timeTotal += Abc_Clock() - clk;
}